

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeInfo.cpp
# Opt level: O0

void Js::ScopeInfo::SaveEnclosingScopeInfo(ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  ScopeType SVar3;
  ScopeInfo *pSVar4;
  FuncInfo *pFVar5;
  undefined4 *puVar6;
  ScriptContext *scriptContext;
  FuncInfo *pFVar7;
  Scope *pSVar8;
  FuncInfo *func_1;
  ScopeInfo *scopeInfo;
  FuncInfo *func;
  Scope *currentScope;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  
  if ((funcInfo->byteCodeFunction == (ParseableFunctionInfo *)0x0) ||
     (pSVar4 = ParseableFunctionInfo::GetScopeInfo(funcInfo->byteCodeFunction),
     pSVar4 == (ScopeInfo *)0x0)) {
    func = (FuncInfo *)ByteCodeGenerator::GetCurrentScope(byteCodeGenerator);
    pFVar5 = Scope::GetFunc((Scope *)func);
    if (pFVar5 != funcInfo) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                  ,0xae,"(currentScope->GetFunc() == funcInfo)",
                                  "currentScope->GetFunc() == funcInfo");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar2 = ParseNodeFnc::IsDeclaredInParamScope(funcInfo->root);
    if (bVar2) {
      SVar3 = Scope::GetScopeType((Scope *)func);
      if (SVar3 != ScopeType_FunctionBody) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                    ,0xb2,"(currentScope->GetScopeType() == ScopeType_FunctionBody)"
                                    ,"currentScope->GetScopeType() == ScopeType_FunctionBody");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pSVar8 = Scope::GetEnclosingScope((Scope *)func);
      if (pSVar8 == (Scope *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                    ,0xb3,"(currentScope->GetEnclosingScope())",
                                    "currentScope->GetEnclosingScope()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pFVar5 = ByteCodeGenerator::GetEnclosingFuncInfo(byteCodeGenerator);
      if (pFVar5 == (FuncInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                    ,0xb6,"(func)","func");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar2 = FuncInfo::IsBodyAndParamScopeMerged(pFVar5);
      if (bVar2) {
        func = (FuncInfo *)FuncInfo::GetParamScope(pFVar5);
        SVar3 = Scope::GetScopeType((Scope *)func);
        if (SVar3 != ScopeType_Parameter) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                      ,0xbb,"(currentScope->GetScopeType() == ScopeType_Parameter)",
                                      "currentScope->GetScopeType() == ScopeType_Parameter");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
    while (pFVar5 = Scope::GetFunc((Scope *)func), pFVar5 == funcInfo) {
      func = (FuncInfo *)Scope::GetEnclosingScope((Scope *)func);
    }
    scriptContext = ByteCodeGenerator::GetScriptContext(byteCodeGenerator);
    pSVar4 = SaveScopeInfo(byteCodeGenerator,(Scope *)func,scriptContext);
    if (pSVar4 != (ScopeInfo *)0x0) {
      bVar2 = ParseNodeFnc::IsDeclaredInParamScope(funcInfo->root);
      if (bVar2) {
        pFVar5 = ByteCodeGenerator::GetEnclosingFuncInfo(byteCodeGenerator);
        if (pFVar5 == (FuncInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                      ,0xca,"(func)","func");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        bVar2 = FuncInfo::IsBodyAndParamScopeMerged(pFVar5);
        if (bVar2) {
          pFVar7 = (FuncInfo *)FuncInfo::GetParamScope(pFVar5);
          if ((func != pFVar7) ||
             (SVar3 = Scope::GetScopeType((Scope *)func), SVar3 != ScopeType_Parameter)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                        ,0xce,
                                        "(currentScope == func->GetParamScope() && currentScope->GetScopeType() == ScopeType_Parameter)"
                                        ,
                                        "currentScope == func->GetParamScope() && currentScope->GetScopeType() == ScopeType_Parameter"
                                       );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          SVar3 = GetScopeType(pSVar4);
          if (SVar3 != ScopeType_Parameter) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                        ,0xcf,"(scopeInfo->GetScopeType() == ScopeType_Parameter)",
                                        "scopeInfo->GetScopeType() == ScopeType_Parameter");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          pSVar8 = FuncInfo::GetBodyScope(pFVar5);
          if (pSVar8 == (Scope *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                        ,0xd0,"(func->GetBodyScope())","func->GetBodyScope()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          pSVar8 = FuncInfo::GetBodyScope(pFVar5);
          bVar2 = Scope::GetMustInstantiate(pSVar8);
          *(ushort *)&pSVar4->field_0x10 =
               *(ushort *)&pSVar4->field_0x10 & 0xfffb | (ushort)bVar2 << 2;
        }
      }
      ParseableFunctionInfo::SetScopeInfo(funcInfo->byteCodeFunction,pSVar4);
    }
  }
  return;
}

Assistant:

void ScopeInfo::SaveEnclosingScopeInfo(ByteCodeGenerator* byteCodeGenerator, FuncInfo* funcInfo)
    {
        // TODO: Not technically necessary, as we always do scope look up on eval if it is
        // not found in the scope chain, and block scopes are always objects in eval.
        // But if we save the global eval block scope for deferred child so that we can look up
        // let/const in that scope with slot index instead of doing a scope lookup.
        // We will have to implement encoding block scope info to enable, which will also
        // enable defer parsing function that are in block scopes.

        if (funcInfo->byteCodeFunction &&
            funcInfo->byteCodeFunction->GetScopeInfo() != nullptr)
        {
            // No need to regenerate scope info if we re-compile an enclosing function
            return;
        }

        Scope* currentScope = byteCodeGenerator->GetCurrentScope();
        Assert(currentScope->GetFunc() == funcInfo);

        if (funcInfo->root->IsDeclaredInParamScope())
        {
            Assert(currentScope->GetScopeType() == ScopeType_FunctionBody);
            Assert(currentScope->GetEnclosingScope());

            FuncInfo* func = byteCodeGenerator->GetEnclosingFuncInfo();
            Assert(func);

            if (func->IsBodyAndParamScopeMerged())
            {
                currentScope = func->GetParamScope();
                Assert(currentScope->GetScopeType() == ScopeType_Parameter);
            }
        }

        while (currentScope->GetFunc() == funcInfo)
        {
            currentScope = currentScope->GetEnclosingScope();
        }

        ScopeInfo * scopeInfo = ScopeInfo::SaveScopeInfo(byteCodeGenerator, currentScope, byteCodeGenerator->GetScriptContext());
        if (scopeInfo != nullptr)
        {
            if (funcInfo->root->IsDeclaredInParamScope())
            {
                FuncInfo* func = byteCodeGenerator->GetEnclosingFuncInfo();
                Assert(func);

                if (func->IsBodyAndParamScopeMerged())
                {
                    Assert(currentScope == func->GetParamScope() && currentScope->GetScopeType() == ScopeType_Parameter);
                    Assert(scopeInfo->GetScopeType() == ScopeType_Parameter);
                    Assert(func->GetBodyScope());

                    // If the current function is nested in the param scope of it's enclosing function we may have
                    // skipped the body scope and in may not be the scope stack but the body scope might still be
                    // in the frame display and we will need to account for it. See ByteCodeGenerateor::FindScopeForSym.
                    scopeInfo->mustInstantiate = func->GetBodyScope()->GetMustInstantiate();
                }
            }
            funcInfo->byteCodeFunction->SetScopeInfo(scopeInfo);
        }
    }